

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O0

QList<QTableWidgetItem_*> * __thiscall QTableWidget::selectedItems(QTableWidget *this)

{
  bool bVar1;
  const_iterator o;
  QTableModel *this_00;
  ulong uVar2;
  QAbstractItemView *in_RSI;
  parameter_type in_RDI;
  long in_FS_OFFSET;
  QTableWidgetItem *item;
  QModelIndex *index;
  QModelIndexList *__range1;
  QTableWidgetPrivate *d;
  QList<QTableWidgetItem_*> *items;
  const_iterator __end1;
  const_iterator __begin1;
  QModelIndexList indexes;
  parameter_type t;
  QTableWidgetItem *in_stack_ffffffffffffff90;
  const_iterator local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  t = in_RDI;
  d_func((QTableWidget *)0x8dbbf1);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemView::selectionModel(in_RSI);
  QItemSelectionModel::selectedIndexes();
  ((DataPointer *)&in_RDI->_vptr_QTableWidgetItem)->d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&in_RDI->rtti = &DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->values).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QList<QTableWidgetItem_*>::QList((QList<QTableWidgetItem_*> *)0x8dbc60);
  local_28.i = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  local_28 = QList<QModelIndex>::begin((QList<QModelIndex> *)in_RSI);
  o = QList<QModelIndex>::end((QList<QModelIndex> *)in_RSI);
  while (bVar1 = QList<QModelIndex>::const_iterator::operator!=(&local_28,o), bVar1) {
    this_00 = (QTableModel *)QList<QModelIndex>::const_iterator::operator*(&local_28);
    uVar2 = (**(code **)(*(long *)&(in_RSI->super_QAbstractScrollArea).super_QFrame.super_QWidget +
                        0x2c0))(in_RSI,this_00);
    if ((uVar2 & 1) == 0) {
      QTableWidgetPrivate::tableModel((QTableWidgetPrivate *)0x8dbd11);
      in_stack_ffffffffffffff90 =
           QTableModel::item(this_00,(QModelIndex *)in_stack_ffffffffffffff90);
      if (in_stack_ffffffffffffff90 != (QTableWidgetItem *)0x0) {
        QList<QTableWidgetItem_*>::append((QList<QTableWidgetItem_*> *)0x8dbd3a,t);
      }
    }
    QList<QModelIndex>::const_iterator::operator++(&local_28);
  }
  QList<QModelIndex>::~QList((QList<QModelIndex> *)0x8dbd6b);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QList<QTableWidgetItem_*> *)t;
  }
  __stack_chk_fail();
}

Assistant:

QList<QTableWidgetItem*> QTableWidget::selectedItems() const
{
    Q_D(const QTableWidget);
    const QModelIndexList indexes = selectionModel()->selectedIndexes();
    QList<QTableWidgetItem*> items;
    for (const auto &index : indexes) {
        if (isIndexHidden(index))
            continue;
        QTableWidgetItem *item = d->tableModel()->item(index);
        if (item)
            items.append(item);
    }
    return items;
}